

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O0

HT_TCPListener * ht_tcp_listener_create(int port,size_t buffer_size,HT_ErrorCode *out_err)

{
  HT_ErrorCode HVar1;
  HT_TCPListener *pHStack_30;
  HT_ErrorCode error_code;
  HT_TCPListener *listener;
  HT_ErrorCode *out_err_local;
  size_t buffer_size_local;
  HT_TCPListener *pHStack_10;
  int port_local;
  
  pHStack_30 = (HT_TCPListener *)ht_alloc(0x40);
  if (pHStack_30 == (HT_TCPListener *)0x0) {
    if (out_err != (HT_ErrorCode *)0x0) {
      *out_err = HT_ERR_OUT_OF_MEMORY;
    }
    pHStack_10 = (HT_TCPListener *)0x0;
  }
  else {
    HVar1 = ht_tcp_listener_init(pHStack_30,port,buffer_size);
    if (HVar1 != HT_ERR_OK) {
      ht_tcp_listener_destroy(pHStack_30);
      pHStack_30 = (HT_TCPListener *)0x0;
    }
    if (out_err != (HT_ErrorCode *)0x0) {
      *out_err = HVar1;
    }
    pHStack_10 = pHStack_30;
  }
  return pHStack_10;
}

Assistant:

HT_TCPListener*
ht_tcp_listener_create(int port, size_t buffer_size, HT_ErrorCode* out_err)
{
    HT_TCPListener* listener = HT_CREATE_TYPE(HT_TCPListener);
    if (!listener)
    {
        HT_SET_ERROR(out_err, HT_ERR_OUT_OF_MEMORY);
        return NULL;
    }

    HT_ErrorCode error_code = ht_tcp_listener_init(listener, port, buffer_size);
    if (error_code != HT_ERR_OK)
    {
        ht_tcp_listener_destroy(listener);
        listener = NULL;
    }

    HT_SET_ERROR(out_err, error_code);
    return listener;
}